

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

SourceBuffer * __thiscall
slang::SourceManager::cacheBuffer
          (SourceBuffer *__return_storage_ptr__,SourceManager *this,path *path,
          SourceLocation includedFrom,vector<char,_std::allocator<char>_> *buffer)

{
  pair<std::_Rb_tree_iterator<std::filesystem::__cxx11::path>,_bool> pVar1;
  pair<_3562ccc5_> pVar2;
  __single_object fd;
  string name;
  unique_lock<std::shared_mutex> lock;
  path local_b0;
  error_code local_88;
  vector<char,_std::allocator<char>_> local_78;
  unique_lock<std::shared_mutex> local_58 [2];
  _Alloc_hider local_38;
  
  local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
  local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  if (this->disableProximatePaths == false) {
    local_88._M_value = 0;
    local_88._M_cat = (error_category *)std::_V2::system_category();
    std::filesystem::proximate(&local_b0,path,&local_88);
    std::__cxx11::string::string((string *)local_58,(string *)&local_b0);
    std::__cxx11::string::operator=((string *)&local_78,(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
    std::filesystem::__cxx11::path::~path(&local_b0);
    if (local_88._M_value != 0) {
      std::__cxx11::string::assign((char *)&local_78,0);
    }
    if (local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish != (pointer)0x0) goto LAB_00190b06;
  }
  std::filesystem::__cxx11::path::filename(&local_b0,path);
  std::__cxx11::string::string((string *)local_58,(string *)&local_b0);
  std::__cxx11::string::operator=((string *)&local_78,(string *)local_58);
  std::__cxx11::string::~string((string *)local_58);
  std::filesystem::__cxx11::path::~path(&local_b0);
LAB_00190b06:
  std::unique_lock<std::shared_mutex>::unique_lock(local_58,&this->mut);
  std::filesystem::__cxx11::path::parent_path();
  pVar1 = std::
          _Rb_tree<std::filesystem::__cxx11::path,_std::filesystem::__cxx11::path,_std::_Identity<std::filesystem::__cxx11::path>,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
          ::_M_insert_unique<std::filesystem::__cxx11::path>(&(this->directories)._M_t,&local_b0);
  local_38._M_p = (pointer)(pVar1.first._M_node._M_node + 1);
  std::
  make_unique<slang::SourceManager::FileData,std::filesystem::__cxx11::path_const*,std::__cxx11::string,std::vector<char,std::allocator<char>>>
            ((path **)&local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38,
             &local_78);
  std::filesystem::__cxx11::path::~path(&local_b0);
  std::__cxx11::string::string((string *)&local_b0,(string *)path);
  pVar2 = ska::detailv3::
          sherwood_v3_table<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>>>
          ::
          emplace<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>
                    ((sherwood_v3_table<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>>>
                      *)&this->lookupCache,&local_b0._M_pathname,
                     (unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
                      *)&local_88);
  std::__cxx11::string::~string((string *)&local_b0);
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    createBufferEntry(__return_storage_ptr__,this,
                      ((pVar2.first.current.current)->field_1).value.second._M_t.
                      super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
                      .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl,
                      includedFrom,(unique_lock<std::shared_mutex> *)buffer);
    std::
    unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
    ::~unique_ptr((unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
                   *)&local_88);
    std::unique_lock<std::shared_mutex>::~unique_lock(local_58);
    std::__cxx11::string::~string((string *)&local_78);
    return __return_storage_ptr__;
  }
  assert::assertFailed
            ("inserted",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/text/SourceManager.cpp"
             ,0x21b,
             "SourceBuffer slang::SourceManager::cacheBuffer(const fs::path &, SourceLocation, std::vector<char> &&)"
            );
}

Assistant:

SourceBuffer SourceManager::cacheBuffer(const fs::path& path, SourceLocation includedFrom,
                                        std::vector<char>&& buffer) {
    std::string name;
    if (!disableProximatePaths) {
        std::error_code ec;
        name = fs::proximate(path, ec).u8string();
        if (ec)
            name = {};
    }

    if (name.empty())
        name = path.filename().u8string();

    std::unique_lock lock(mut);

    auto fd = std::make_unique<FileData>(&*directories.insert(path.parent_path()).first,
                                         std::move(name), std::move(buffer));

    auto [it, inserted] = lookupCache.emplace(path.u8string(), std::move(fd));
    ASSERT(inserted);

    FileData* fdPtr = it->second.get();
    return createBufferEntry(fdPtr, includedFrom, lock);
}